

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall
wasm::ModAsyncify<true,_false,_true>::visitSelect(ModAsyncify<true,_false,_true> *this,Select *curr)

{
  bool bVar1;
  Module *wasm;
  Const *pCVar2;
  Builder local_28;
  Builder builder;
  GlobalGet *get;
  Select *curr_local;
  ModAsyncify<true,_false,_true> *this_local;
  
  builder.wasm = (Module *)Expression::dynCast<wasm::GlobalGet>(curr->condition);
  if ((builder.wasm != (Module *)0x0) &&
     (bVar1 = IString::operator!=((IString *)
                                  &((builder.wasm)->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  &(this->asyncifyStateName).super_IString), !bVar1)) {
    wasm = Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
           ::getModule((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                        *)&(this->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                      );
    Builder::Builder(&local_28,wasm);
    pCVar2 = Builder::makeConst<int>(&local_28,0);
    curr->condition = (Expression *)pCVar2;
  }
  return;
}

Assistant:

void visitSelect(Select* curr) {
    auto* get = curr->condition->dynCast<GlobalGet>();
    if (!get || get->name != asyncifyStateName) {
      return;
    }
    // This is a comparison of the state to zero, which means we are checking
    // "if running normally, run this code, but if rewinding, ignore it". If
    // we know we'll never rewind, we can optimize this.
    if (neverRewind) {
      Builder builder(*this->getModule());
      curr->condition = builder.makeConst(int32_t(0));
    }
  }